

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.hpp
# Opt level: O2

int * __thiscall
cs::mapping<cs::signal_types,_int>::match(mapping<cs::signal_types,_int> *this,signal_types *k)

{
  bool bVar1;
  mapped_type_conflict *pmVar2;
  compile_error *this_00;
  allocator local_31;
  string local_30;
  
  bVar1 = exist(this,k);
  if (bVar1) {
    pmVar2 = std::
             map<cs::signal_types,_int,_std::less<cs::signal_types>,_std::allocator<std::pair<const_cs::signal_types,_int>_>_>
             ::at(&this->mDat,k);
    return pmVar2;
  }
  this_00 = (compile_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_30,"Undefined Mapping.",&local_31);
  compile_error::compile_error(this_00,&local_30);
  __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

const T &match(const Key &k) const
		{
			if (!exist(k))
				throw compile_error("Undefined Mapping.");
			return mDat.at(k);
		}